

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapePrism> *copy)

{
  long in_RDX;
  TPZIntelGen<pzshape::TPZShapePrism> *in_RDI;
  TPZCompMesh *in_stack_ffffffffffffffc0;
  TPZManVector<long,_6> *this_00;
  TPZManVector<int,_5> *in_stack_ffffffffffffffc8;
  TPZIntelGen<pzshape::TPZShapePrism> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDiv<pzshape::TPZShapePrism>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024bcca8);
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (in_stack_ffffffffffffffd0,(void **)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_RDI);
  *(undefined ***)
   &(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDiv_024bc888;
  *(undefined ***)
   &(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDiv_024bc888;
  TPZManVector<int,_5>::TPZManVector
            ((TPZManVector<int,_5> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a13b5b);
  this_00 = (TPZManVector<long,_6> *)0xffffffffffffffff;
  TPZManVector<long,_6>::TPZManVector
            ((TPZManVector<long,_6> *)in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8,
             (long *)0xffffffffffffffff);
  *(undefined4 *)&in_RDI[2].fIntRule.super_TPZIntPoints._vptr_TPZIntPoints =
       *(undefined4 *)(in_RDX + 0x110);
  (in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder =
       *(int *)(in_RDX + 0x28);
  TPZManVector<long,_6>::operator=(this_00,(TPZManVector<long,_6> *)in_RDI);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, const TPZCompElHDiv<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
    this->fConnectIndexes = copy.fConnectIndexes;
}